

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O2

void __thiscall soplex::SSVectorBase<double>::setValue(SSVectorBase<double> *this,int i,double x)

{
  int n;
  double dVar1;
  ulong in_XMM0_Qb;
  int i_local;
  double local_38;
  ulong uStack_30;
  double local_28;
  ulong uStack_20;
  
  if (this->setupStatus == true) {
    i_local = i;
    local_38 = x;
    uStack_30 = in_XMM0_Qb;
    n = IdxSet::pos(&this->super_IdxSet,i);
    if (n < 0) {
      local_28 = ABS(local_38);
      uStack_20 = uStack_30 & 0x7fffffffffffffff;
      dVar1 = getEpsilon(this);
      x = local_38;
      if (dVar1 < local_28) {
        IdxSet::add(&this->super_IdxSet,1,&i_local);
        x = local_38;
        i = i_local;
      }
    }
    else {
      x = local_38;
      if ((local_38 == 0.0) && (!NAN(local_38))) {
        clearNum(this,n);
        x = local_38;
      }
    }
  }
  (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[i] = x;
  return;
}

Assistant:

void setValue(int i, R x)
   {
      assert(i >= 0);
      assert(i < VectorBase<R>::dim());

      if(isSetup())
      {
         int n = pos(i);

         if(n < 0)
         {
            if(spxAbs(x) > this->getEpsilon())
               IdxSet::add(1, &i);
         }
         else if(x == R(0))
            clearNum(n);
      }

      VectorBase<R>::val[i] = x;

      assert(isConsistent());
   }